

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_decoder__postinit(ma_decoder_config *pConfig,ma_decoder *pDecoder)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  ma_resampling_backend_vtable *pmVar5;
  _func_ma_result_void_ptr_ma_resampling_backend_ptr_ma_uint64_ma_uint64_ptr *p_Var6;
  _func_void_ptr_size_t_void_ptr *p_Var7;
  ulong uVar8;
  ma_result mVar9;
  void *pvVar10;
  ma_uint32 internalChannels;
  ma_format internalFormat;
  ma_uint32 internalSampleRate;
  ma_uint64 unused;
  ma_channel internalChannelMap [254];
  uint local_1b4;
  ma_format local_1b0;
  ma_uint32 local_1ac;
  ma_uint64 local_1a8;
  ma_data_converter_config local_1a0;
  ma_channel local_128 [264];
  
  mVar9 = ma_data_source_get_data_format
                    (pDecoder->pBackend,&local_1b0,&local_1b4,&local_1ac,local_128,0xfe);
  if (mVar9 == MA_SUCCESS) {
    uVar3 = pConfig->channels;
    mVar9 = MA_INVALID_ARGS;
    if (local_1b4 < 0xff && uVar3 < 0xff) {
      local_1a0.formatOut = pConfig->format;
      if (pConfig->format == ma_format_unknown) {
        local_1a0.formatOut = local_1b0;
      }
      pDecoder->outputFormat = local_1a0.formatOut;
      local_1a0.channelsOut = uVar3;
      if (uVar3 == 0) {
        local_1a0.channelsOut = local_1b4;
      }
      pDecoder->outputChannels = local_1a0.channelsOut;
      local_1a0.sampleRateOut = pConfig->sampleRate;
      if (pConfig->sampleRate == 0) {
        local_1a0.sampleRateOut = local_1ac;
      }
      pDecoder->outputSampleRate = local_1a0.sampleRateOut;
      local_1a0.calculateLFEFromSpatialChannels = 0;
      local_1a0._52_4_ = 0;
      local_1a0.ppChannelWeights = (float **)0x0;
      local_1a0._68_4_ = 0;
      local_1a0.formatIn = local_1b0;
      local_1a0.channelsIn = local_1b4;
      local_1a0.sampleRateIn = local_1ac;
      local_1a0.pChannelMapOut = pConfig->pChannelMap;
      uVar1 = pConfig->channelMixMode;
      uVar2 = pConfig->ditherMode;
      local_1a0.channelMixMode = uVar1;
      local_1a0.ditherMode = uVar2;
      local_1a0.allowDynamicSampleRate = 0;
      local_1a0.resampling.format = (pConfig->resampling).format;
      local_1a0.resampling.channels = (pConfig->resampling).channels;
      local_1a0.resampling.sampleRateIn = (pConfig->resampling).sampleRateIn;
      local_1a0.resampling.sampleRateOut = (pConfig->resampling).sampleRateOut;
      local_1a0.resampling.algorithm = (pConfig->resampling).algorithm;
      local_1a0.resampling._20_4_ = *(undefined4 *)&(pConfig->resampling).field_0x14;
      local_1a0.resampling.pBackendVTable = (pConfig->resampling).pBackendVTable;
      local_1a0.resampling.pBackendUserData = (pConfig->resampling).pBackendUserData;
      local_1a0.resampling.linear.lpfOrder = (pConfig->resampling).linear.lpfOrder;
      local_1a0.resampling._44_4_ = *(undefined4 *)&(pConfig->resampling).field_0x2c;
      local_1a0.pChannelMapIn = local_128;
      mVar9 = ma_data_converter_init(&local_1a0,&pDecoder->allocationCallbacks,&pDecoder->converter)
      ;
      if (mVar9 == MA_SUCCESS) {
        local_1a8 = 0;
        if (((pDecoder->converter).hasResampler == '\0') ||
           (((pmVar5 = (pDecoder->converter).resampler.pBackendVTable,
             pmVar5 != (ma_resampling_backend_vtable *)0x0 &&
             (p_Var6 = pmVar5->onGetRequiredInputFrameCount,
             p_Var6 != (_func_ma_result_void_ptr_ma_resampling_backend_ptr_ma_uint64_ma_uint64_ptr *
                       )0x0)) &&
            (mVar9 = (*p_Var6)((pDecoder->converter).resampler.pBackendUserData,
                               (pDecoder->converter).resampler.pBackend,1,&local_1a8),
            mVar9 == MA_SUCCESS)))) {
          return MA_SUCCESS;
        }
        iVar4 = *(int *)(&DAT_0019a900 + (ulong)local_1b0 * 4);
        uVar8 = 0x1000 / (ulong)(iVar4 * local_1b4);
        pDecoder->inputCacheCap = uVar8;
        p_Var7 = (pDecoder->allocationCallbacks).onMalloc;
        if (p_Var7 == (_func_void_ptr_size_t_void_ptr *)0x0) {
          pDecoder->pInputCache = (void *)0x0;
        }
        else {
          pvVar10 = (*p_Var7)(uVar8 * (iVar4 * local_1b4),(pDecoder->allocationCallbacks).pUserData)
          ;
          pDecoder->pInputCache = pvVar10;
          if (pvVar10 != (void *)0x0) {
            return MA_SUCCESS;
          }
        }
        ma_data_converter_uninit(&pDecoder->converter,&pDecoder->allocationCallbacks);
        mVar9 = MA_OUT_OF_MEMORY;
      }
    }
  }
  ma_decoder_uninit(pDecoder);
  return mVar9;
}

Assistant:

static ma_result ma_decoder__postinit(const ma_decoder_config* pConfig, ma_decoder* pDecoder)
{
    ma_result result;

    result = ma_decoder__init_data_converter(pDecoder, pConfig);

    /* If we failed post initialization we need to uninitialize the decoder before returning to prevent a memory leak. */
    if (result != MA_SUCCESS) {
        ma_decoder_uninit(pDecoder);
        return result;
    }

    return result;
}